

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

void __thiscall
Js::FunctionBody::UpdateActiveFunctionSet
          (FunctionBody *this,ActiveFunctionSet *pActiveFuncs,
          FunctionCodeGenRuntimeData *callSiteData)

{
  BOOLEAN BVar1;
  uint32 uVar2;
  Type *pTVar3;
  FunctionBody *pFVar4;
  
  if (callSiteData != (FunctionCodeGenRuntimeData *)0x0) {
    pTVar3 = (callSiteData->inlinees).ptr;
    pFVar4 = this;
    if (pTVar3 != (Type *)0x0) {
      UpdateActiveFunctionsForOneDataSet
                (this,pActiveFuncs,callSiteData,pTVar3,(uint)this->profiledCallSiteCount);
    }
    pTVar3 = (callSiteData->ldFldInlinees).ptr;
    if (pTVar3 != (Type *)0x0) {
      pFVar4 = this;
      uVar2 = GetCountField(this,InlineCacheCount);
      UpdateActiveFunctionsForOneDataSet(pFVar4,pActiveFuncs,callSiteData,pTVar3,uVar2);
    }
    pTVar3 = (callSiteData->callbackInlinees).ptr;
    if (pTVar3 != (Type *)0x0) {
      UpdateActiveFunctionsForOneDataSet
                (pFVar4,pActiveFuncs,callSiteData,pTVar3,(uint)this->profiledCallSiteCount);
    }
    pTVar3 = (callSiteData->callApplyTargetInlinees).ptr;
    if (pTVar3 != (Type *)0x0) {
      pFVar4 = this;
      uVar2 = GetCountField(this,ProfiledCallApplyCallSiteCount);
      UpdateActiveFunctionsForOneDataSet(pFVar4,pActiveFuncs,callSiteData,pTVar3,uVar2 & 0xffff);
    }
  }
  BVar1 = BVSparse<Memory::ArenaAllocator>::TestAndSet
                    (pActiveFuncs,
                     (this->super_ParseableFunctionInfo).super_FunctionProxy.m_functionNumber);
  if (BVar1 == '\0') {
    pFVar4 = this;
    pTVar3 = (Type *)FunctionProxy::GetAuxPtr((FunctionProxy *)this,CodeGenRuntimeData);
    if (pTVar3 != (Type *)0x0) {
      UpdateActiveFunctionsForOneDataSet
                (pFVar4,pActiveFuncs,(FunctionCodeGenRuntimeData *)0x0,pTVar3,
                 (uint)this->profiledCallSiteCount);
    }
    pTVar3 = (Type *)FunctionProxy::GetAuxPtr((FunctionProxy *)this,CodeGenGetSetRuntimeData);
    if (pTVar3 != (Type *)0x0) {
      pFVar4 = this;
      uVar2 = GetCountField(this,InlineCacheCount);
      UpdateActiveFunctionsForOneDataSet
                (pFVar4,pActiveFuncs,(FunctionCodeGenRuntimeData *)0x0,pTVar3,uVar2);
    }
    pFVar4 = this;
    pTVar3 = (Type *)FunctionProxy::GetAuxPtr((FunctionProxy *)this,CodeGenCallbackRuntimeData);
    if (pTVar3 != (Type *)0x0) {
      UpdateActiveFunctionsForOneDataSet
                (pFVar4,pActiveFuncs,(FunctionCodeGenRuntimeData *)0x0,pTVar3,
                 (uint)this->profiledCallSiteCount);
    }
    pTVar3 = (Type *)FunctionProxy::GetAuxPtr
                               ((FunctionProxy *)this,CodeGenCallApplyTargetRuntimeData);
    if (pTVar3 != (Type *)0x0) {
      uVar2 = GetCountField(this,ProfiledCallApplyCallSiteCount);
      UpdateActiveFunctionsForOneDataSet
                (this,pActiveFuncs,(FunctionCodeGenRuntimeData *)0x0,pTVar3,uVar2 & 0xffff);
      return;
    }
  }
  return;
}

Assistant:

void FunctionBody::UpdateActiveFunctionSet(ActiveFunctionSet *pActiveFuncs, FunctionCodeGenRuntimeData *callSiteData) const
    {
        // Always walk the inlinee and ldFldInlinee data (if we have them), as they are different at each call site.
        if (callSiteData)
        {
            if (callSiteData->GetInlinees())
            {
                this->UpdateActiveFunctionsForOneDataSet(pActiveFuncs, callSiteData, callSiteData->GetInlinees(), this->GetProfiledCallSiteCount());
            }
            if (callSiteData->GetLdFldInlinees())
            {
                this->UpdateActiveFunctionsForOneDataSet(pActiveFuncs, callSiteData, callSiteData->GetLdFldInlinees(), this->GetInlineCacheCount());
            }
            if (callSiteData->GetCallbackInlinees())
            {
                this->UpdateActiveFunctionsForOneDataSet(pActiveFuncs, callSiteData, callSiteData->GetCallbackInlinees(), this->GetProfiledCallSiteCount());
            }
            if (callSiteData->GetCallApplyTargetInlinees())
            {
                this->UpdateActiveFunctionsForOneDataSet(pActiveFuncs, callSiteData, callSiteData->GetCallApplyTargetInlinees(), this->GetProfiledCallApplyCallSiteCount());
            }
        }

        // Now walk the top-level data, but only do it once, since it's always the same.

        if (this->TestAndUpdateActiveFunctions(pActiveFuncs))
        {
            return;
        }
        {
            Field(FunctionCodeGenRuntimeData*)* data = this->GetCodeGenRuntimeData();
            if (data != nullptr)
            {
                this->UpdateActiveFunctionsForOneDataSet(pActiveFuncs, nullptr, data, this->GetProfiledCallSiteCount());
            }
        }
        {
            Field(FunctionCodeGenRuntimeData*)* data = this->GetCodeGenGetSetRuntimeData();
            if (data != nullptr)
            {
                this->UpdateActiveFunctionsForOneDataSet(pActiveFuncs, nullptr, data, this->GetInlineCacheCount());
            }
        }
        {
            Field(FunctionCodeGenRuntimeData*)* data = this->GetCodeGenCallbackRuntimeData();
            if (data != nullptr)
            {
                this->UpdateActiveFunctionsForOneDataSet(pActiveFuncs, nullptr, data, this->GetProfiledCallSiteCount());
            }
        }
        {
#if ENABLE_NATIVE_CODEGEN
            Field(FunctionCodeGenRuntimeData*)* data = this->GetCodeGenCallApplyTargetRuntimeData();
            if (data != nullptr)
            {
                this->UpdateActiveFunctionsForOneDataSet(pActiveFuncs, nullptr, data, this->GetProfiledCallApplyCallSiteCount());
            }
#endif
        }
    }